

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool __thiscall cfd::core::Psbt::IsFinalized(Psbt *this)

{
  CfdException *this_00;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  int local_24;
  size_t sStack_20;
  int ret;
  size_t data;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  
  data = (size_t)this->wally_psbt_pointer_;
  sStack_20 = 0;
  psbt_pointer = (wally_psbt *)this;
  local_24 = wally_psbt_is_finalized((wally_psbt *)data,&stack0xffffffffffffffe0);
  if (local_24 != 0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x802;
    local_40.funcname = "IsFinalized";
    logger::warn<int&>(&local_40,"wally_psbt_is_finalized NG[{}]",&local_24);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"psbt check finalized error.",&local_61);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_60);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return sStack_20 == 1;
}

Assistant:

bool Psbt::IsFinalized() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t data = 0;
  int ret = wally_psbt_is_finalized(psbt_pointer, &data);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_is_finalized NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt check finalized error.");
  }
  return (data == 1);
}